

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactorDebug.cpp
# Opt level: O2

void debugReportRankDeficiency
               (HighsInt call_id,HighsInt highs_debug_level,HighsLogOptions *log_options,
               HighsInt num_row,vector<int,_std::allocator<int>_> *permute,
               vector<int,_std::allocator<int>_> *iwork,HighsInt *basic_index,
               HighsInt rank_deficiency,vector<int,_std::allocator<int>_> *row_with_no_pivot,
               vector<int,_std::allocator<int>_> *col_with_no_pivot)

{
  ulong uVar1;
  ulong uVar2;
  HighsInt i_2;
  HighsInt i;
  uint uVar3;
  HighsInt i_1;
  
  if (highs_debug_level != 0) {
    if (call_id == 1) {
      if (rank_deficiency < 0x65) {
        uVar3 = 0;
        highsLogDev(log_options,kWarning,"buildRankDeficiency1:");
        highsLogDev(log_options,kWarning,"\nIndex  ");
        if (rank_deficiency < 1) {
          rank_deficiency = 0;
        }
        for (; rank_deficiency != uVar3; uVar3 = uVar3 + 1) {
          highsLogDev(log_options,kWarning," %2d",(ulong)uVar3);
        }
        highsLogDev(log_options,kWarning,"\nrow_with_no_pivot  ");
        for (uVar1 = 0; (uint)rank_deficiency != uVar1; uVar1 = uVar1 + 1) {
          highsLogDev(log_options,kWarning," %2d",
                      (ulong)(uint)(row_with_no_pivot->super__Vector_base<int,_std::allocator<int>_>
                                   )._M_impl.super__Vector_impl_data._M_start[uVar1]);
        }
        highsLogDev(log_options,kWarning,"\ncol_with_no_pivot  ");
        for (uVar1 = 0; (uint)rank_deficiency != uVar1; uVar1 = uVar1 + 1) {
          highsLogDev(log_options,kWarning," %2d",
                      (ulong)(uint)(col_with_no_pivot->super__Vector_base<int,_std::allocator<int>_>
                                   )._M_impl.super__Vector_impl_data._M_start[uVar1]);
        }
        highsLogDev(log_options,kWarning,"\n");
        if (num_row < 0x7c) {
          highsLogDev(log_options,kWarning,"Index  ");
          if (num_row < 1) {
            num_row = 0;
          }
          for (uVar3 = 0; num_row != uVar3; uVar3 = uVar3 + 1) {
            highsLogDev(log_options,kWarning," %2d",(ulong)uVar3);
          }
          highsLogDev(log_options,kWarning,"\nIwork  ");
          for (uVar1 = 0; (uint)num_row != uVar1; uVar1 = uVar1 + 1) {
            highsLogDev(log_options,kWarning," %2d",
                        (ulong)(uint)(iwork->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                     super__Vector_impl_data._M_start[uVar1]);
          }
          goto LAB_0035af1b;
        }
      }
    }
    else if (call_id == 0) {
      if (num_row < 0x7c) {
        highsLogDev(log_options,kWarning,"buildRankDeficiency0:");
        highsLogDev(log_options,kWarning,"\nIndex  ");
        if (num_row < 1) {
          num_row = 0;
        }
        for (uVar3 = 0; num_row != uVar3; uVar3 = uVar3 + 1) {
          highsLogDev(log_options,kWarning," %2d",(ulong)uVar3);
        }
        highsLogDev(log_options,kWarning,"\nPerm   ");
        uVar2 = (ulong)(uint)num_row;
        for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
          highsLogDev(log_options,kWarning," %2d",
                      (ulong)(uint)(permute->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start[uVar1]);
        }
        highsLogDev(log_options,kWarning,"\nIwork  ");
        for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
          highsLogDev(log_options,kWarning," %2d",
                      (ulong)(uint)(iwork->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start[uVar1]);
        }
        highsLogDev(log_options,kWarning,"\nBaseI  ");
        for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
          highsLogDev(log_options,kWarning," %2d",(ulong)(uint)basic_index[uVar1]);
        }
LAB_0035af1b:
        highsLogDev(log_options,kWarning,"\n");
        return;
      }
    }
    else if (num_row < 0x7c && call_id == 2) {
      highsLogDev(log_options,kWarning,"buildRankDeficiency2:");
      highsLogDev(log_options,kWarning,"\nIndex  ");
      if (num_row < 1) {
        num_row = 0;
      }
      for (uVar3 = 0; num_row != uVar3; uVar3 = uVar3 + 1) {
        highsLogDev(log_options,kWarning," %2d",(ulong)uVar3);
      }
      highsLogDev(log_options,kWarning,"\nPerm   ");
      for (uVar1 = 0; (uint)num_row != uVar1; uVar1 = uVar1 + 1) {
        highsLogDev(log_options,kWarning," %2d",
                    (ulong)(uint)(permute->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start[uVar1]);
      }
      goto LAB_0035af1b;
    }
  }
  return;
}

Assistant:

void debugReportRankDeficiency(
    const HighsInt call_id, const HighsInt highs_debug_level,
    const HighsLogOptions& log_options, const HighsInt num_row,
    const vector<HighsInt>& permute, const vector<HighsInt>& iwork,
    const HighsInt* basic_index, const HighsInt rank_deficiency,
    const vector<HighsInt>& row_with_no_pivot,
    const vector<HighsInt>& col_with_no_pivot) {
  if (highs_debug_level == kHighsDebugLevelNone) return;
  if (call_id == 0) {
    if (num_row > 123) return;
    highsLogDev(log_options, HighsLogType::kWarning, "buildRankDeficiency0:");
    highsLogDev(log_options, HighsLogType::kWarning, "\nIndex  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  i);
    highsLogDev(log_options, HighsLogType::kWarning, "\nPerm   ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  permute[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\nIwork  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  iwork[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\nBaseI  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  basic_index[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\n");
  } else if (call_id == 1) {
    if (rank_deficiency > 100) return;
    highsLogDev(log_options, HighsLogType::kWarning, "buildRankDeficiency1:");
    highsLogDev(log_options, HighsLogType::kWarning, "\nIndex  ");
    for (HighsInt i = 0; i < rank_deficiency; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  i);
    highsLogDev(log_options, HighsLogType::kWarning, "\nrow_with_no_pivot  ");
    for (HighsInt i = 0; i < rank_deficiency; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  row_with_no_pivot[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\ncol_with_no_pivot  ");
    for (HighsInt i = 0; i < rank_deficiency; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  col_with_no_pivot[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\n");
    if (num_row > 123) return;
    highsLogDev(log_options, HighsLogType::kWarning, "Index  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  i);
    highsLogDev(log_options, HighsLogType::kWarning, "\nIwork  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  iwork[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\n");
  } else if (call_id == 2) {
    if (num_row > 123) return;
    highsLogDev(log_options, HighsLogType::kWarning, "buildRankDeficiency2:");
    highsLogDev(log_options, HighsLogType::kWarning, "\nIndex  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  i);
    highsLogDev(log_options, HighsLogType::kWarning, "\nPerm   ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  permute[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\n");
  }
}